

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Matrix44<float> *
Imath_3_2::addOffset<float>
          (Matrix44<float> *inMat,Vec3<float> *tOffset,Vec3<float> *rOffset,Vec3<float> *sOffset,
          Matrix44<float> *ref)

{
  float *pfVar1;
  Vec3<float> *in_RCX;
  Vec3<float> *in_RDX;
  Matrix44<float> *in_RDI;
  Vec3<float> *in_R8;
  Matrix44<float> S;
  Vec3<float> _rOffset;
  Matrix44<float> O;
  Matrix44<float> *X;
  undefined4 in_stack_fffffffffffffea0;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3<float> *in_stack_ffffffffffffff18;
  Matrix44<float> *in_stack_ffffffffffffff20;
  Matrix44<float> local_bc;
  Vec3<float> local_7c;
  Matrix44<float> local_70;
  Vec3<float> *local_28;
  Vec3<float> *local_20;
  Vec3<float> *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Matrix44<float>::Matrix44(&local_70);
  Vec3<float>::Vec3(&local_7c,local_20);
  Vec3<float>::operator*=(&local_7c,0.017453292);
  Matrix44<float>::rotate<float>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pfVar1 = Vec3<float>::operator[](local_18,0);
  fVar2 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](&local_70,3);
  *pfVar1 = fVar2;
  pfVar1 = Vec3<float>::operator[](local_18,1);
  fVar3 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](&local_70,3);
  pfVar1[1] = fVar3;
  pfVar1 = Vec3<float>::operator[](local_18,2);
  fVar4 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](&local_70,3);
  pfVar1[2] = fVar4;
  Matrix44<float>::Matrix44(&local_bc);
  Matrix44<float>::scale<float>(&local_bc,local_28);
  Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(fVar4,fVar3),
             (Matrix44<float> *)CONCAT44(fVar2,in_stack_fffffffffffffea0));
  Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(fVar4,fVar3),
             (Matrix44<float> *)CONCAT44(fVar2,in_stack_fffffffffffffea0));
  Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(fVar4,fVar3),
             (Matrix44<float> *)CONCAT44(fVar2,in_stack_fffffffffffffea0));
  return in_RDI;
}

Assistant:

Matrix44<T>
addOffset (
    const Matrix44<T>& inMat,
    const Vec3<T>&     tOffset,
    const Vec3<T>&     rOffset,
    const Vec3<T>&     sOffset,
    const Matrix44<T>& ref)
{
    Matrix44<T> O;

    Vec3<T> _rOffset (rOffset);
    _rOffset *= T(M_PI / 180.0);
    O.rotate (_rOffset);

    O[3][0] = tOffset[0];
    O[3][1] = tOffset[1];
    O[3][2] = tOffset[2];

    Matrix44<T> S;
    S.scale (sOffset);

    Matrix44<T> X = S * O * inMat * ref;

    return X;
}